

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTPressureLPS25H.cpp
# Opt level: O0

bool __thiscall RTPressureLPS25H::pressureInit(RTPressureLPS25H *this)

{
  bool bVar1;
  RTPressureLPS25H *this_local;
  
  this->m_pressureAddr = ((this->super_RTPressure).m_settings)->m_I2CPressureAddress;
  bVar1 = RTIMUHal::HALWrite(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                             this->m_pressureAddr,' ',0xc4,"Failed to set LPS25H CTRL_REG_1");
  if (bVar1) {
    bVar1 = RTIMUHal::HALWrite(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                               this->m_pressureAddr,'\x10','\x05',"Failed to set LPS25H RES_CONF");
    if (bVar1) {
      bVar1 = RTIMUHal::HALWrite(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                                 this->m_pressureAddr,'.',0xc0,"Failed to set LPS25H FIFO_CTRL");
      if (bVar1) {
        bVar1 = RTIMUHal::HALWrite(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                                   this->m_pressureAddr,'!','@',"Failed to set LPS25H CTRL_REG_2");
        if (bVar1) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RTPressureLPS25H::pressureInit()
{
    m_pressureAddr = m_settings->m_I2CPressureAddress;

    if (!m_settings->HALWrite(m_pressureAddr, LPS25H_CTRL_REG_1, 0xc4, "Failed to set LPS25H CTRL_REG_1"))
        return false;

    if (!m_settings->HALWrite(m_pressureAddr, LPS25H_RES_CONF, 0x05, "Failed to set LPS25H RES_CONF"))
        return false;

    if (!m_settings->HALWrite(m_pressureAddr, LPS25H_FIFO_CTRL, 0xc0, "Failed to set LPS25H FIFO_CTRL"))
        return false;

    if (!m_settings->HALWrite(m_pressureAddr, LPS25H_CTRL_REG_2, 0x40, "Failed to set LPS25H CTRL_REG_2"))
        return false;

    return true;
}